

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vec4f * __thiscall
DepthShader::vertex(vec4f *__return_storage_ptr__,DepthShader *this,Model *model,int iface,
                   int nthvert)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  size_t i;
  bool bVar6;
  double ret_1;
  double dVar7;
  undefined4 uVar8;
  vec<4UL,_double> ret;
  vec<4UL,_double> ret_2;
  vec<3UL,_double> ret_3;
  double local_148 [4];
  undefined1 local_128 [120];
  undefined1 local_b0 [8];
  mat<4UL,_4UL> local_a8;
  
  Model::vert((vec3f *)local_128,model,(long)iface,(long)nthvert);
  __return_storage_ptr__->data[2] = 0.0;
  __return_storage_ptr__->data[3] = 0.0;
  __return_storage_ptr__->data[0] = 0.0;
  __return_storage_ptr__->data[1] = 0.0;
  i = 3;
  do {
    dVar7 = 1.0;
    if (i + 1 < 4) {
      dVar7 = vec<3UL,_double>::operator[]((vec3f *)local_128,i);
    }
    __return_storage_ptr__->data[i] = dVar7;
    bVar6 = i != 0;
    i = i - 1;
  } while (bVar6);
  operator*(&local_a8,&(this->super_IShader).uniform_Viewport,
            &(this->super_IShader).uniform_Projection);
  operator*((mat<4UL,_4UL> *)local_128,&local_a8,&(this->super_IShader).uniform_ModelView);
  local_148[2] = 0.0;
  local_148[3] = 0.0;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  lVar3 = 4;
  puVar4 = local_b0;
  do {
    lVar3 = lVar3 + -1;
    dVar7 = 0.0;
    lVar5 = 0;
    do {
      dVar7 = dVar7 + *(double *)(puVar4 + lVar5 * 8) * __return_storage_ptr__->data[lVar5 + 3];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -4);
    local_148[lVar3] = dVar7;
    puVar4 = puVar4 + -0x20;
  } while (lVar3 != 0);
  __return_storage_ptr__->data[2] = local_148[2];
  __return_storage_ptr__->data[3] = local_148[3];
  __return_storage_ptr__->data[0] = local_148[0];
  __return_storage_ptr__->data[1] = local_148[1];
  dVar7 = __return_storage_ptr__->data[3];
  uVar8 = (undefined4)((ulong)dVar7 >> 0x20);
  auVar1._8_4_ = SUB84(dVar7,0);
  auVar1._0_8_ = dVar7;
  auVar1._12_4_ = uVar8;
  local_128._16_16_ = divpd(*(undefined1 (*) [16])(__return_storage_ptr__->data + 2),auVar1);
  auVar2._8_4_ = SUB84(dVar7,0);
  auVar2._0_8_ = dVar7;
  auVar2._12_4_ = uVar8;
  local_128._0_16_ = divpd(*(undefined1 (*) [16])__return_storage_ptr__->data,auVar2);
  local_a8.rows[0].data[0] = 0.0;
  local_a8.rows[0].data[1] = 0.0;
  local_a8.rows[0].data[2] = 0.0;
  lVar3 = 3;
  do {
    lVar5 = (ulong)(lVar3 != 2) * 8 + 8;
    if (lVar3 == 1) {
      lVar5 = 0;
    }
    *(undefined8 *)((long)local_a8.rows[0].data + lVar5) =
         *(undefined8 *)(local_128 + lVar3 * 8 + -8);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  mat<3UL,_3UL>::set_col(&this->varying_tri,(long)nthvert,(vec<3UL,_double> *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

virtual vec4f vertex(Model& model, int iface, int nthvert)
    {
        vec4f gl_Vertex = embed<4>(model.vert(iface, nthvert));  // read the vertex from .obj file
        gl_Vertex = uniform_Viewport * uniform_Projection * uniform_ModelView *
                    gl_Vertex;  // transform it to screen coordinates
        varying_tri.set_col(nthvert, proj<3>(gl_Vertex / gl_Vertex[3]));
        return gl_Vertex;
    }